

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::anon_unknown_0::CWriter::FindUniqueName
          (string *__return_storage_ptr__,CWriter *this,SymbolSet *set,string_view proposed_name)

{
  unsigned_long __val;
  bool bVar1;
  _Self local_c0;
  _Self local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  unsigned_long local_70;
  size_t count;
  string base;
  _Self local_40;
  allocator<char> local_32;
  undefined1 local_31;
  SymbolSet *local_30;
  SymbolSet *set_local;
  CWriter *this_local;
  string_view proposed_name_local;
  string *unique;
  
  proposed_name_local._M_len = (size_t)proposed_name._M_str;
  this_local = (CWriter *)proposed_name._M_len;
  local_31 = 0;
  local_30 = set;
  set_local = (SymbolSet *)this;
  proposed_name_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_32);
  std::allocator<char>::~allocator(&local_32);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(local_30,__return_storage_ptr__);
  base.field_2._8_8_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_30);
  bVar1 = std::operator!=(&local_40,(_Self *)((long)&base.field_2 + 8));
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count,
                   __return_storage_ptr__,"_");
    local_70 = 0;
    do {
      __val = local_70;
      local_70 = local_70 + 1;
      std::__cxx11::to_string(&local_b0,__val);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count,
                     &local_b0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      local_b8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(local_30,__return_storage_ptr__);
      local_c0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_30);
      bVar1 = std::operator!=(&local_b8,&local_c0);
    } while (bVar1);
    std::__cxx11::string::~string((string *)&count);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::FindUniqueName(SymbolSet& set,
                                    std::string_view proposed_name) const {
  std::string unique{proposed_name};
  if (set.find(unique) != set.end()) {
    std::string base = unique + "_";
    size_t count = 0;
    do {
      unique = base + std::to_string(count++);
    } while (set.find(unique) != set.end());
  }
  return unique;
}